

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

void __thiscall
FIX::double_conversion::FillDigits32
          (double_conversion *this,uint32_t number,Vector<char> buffer,int *length)

{
  char cVar1;
  char cVar2;
  byte *pbVar3;
  char *pcVar4;
  int *piVar5;
  int index;
  ulong uVar6;
  undefined4 in_register_00000034;
  int iVar7;
  int index_00;
  Vector<char> buffer_local;
  
  buffer_local.start_ = (char *)CONCAT44(in_register_00000034,number);
  piVar5 = buffer._8_8_;
  buffer_local.length_ = (int)buffer.start_;
  iVar7 = 0;
  for (uVar6 = (ulong)this & 0xffffffff; (int)uVar6 != 0; uVar6 = uVar6 / 10) {
    pbVar3 = (byte *)Vector<char>::operator[](&buffer_local,*piVar5 + iVar7);
    *pbVar3 = (byte)(uVar6 % 10) | 0x30;
    iVar7 = iVar7 + 1;
  }
  index_00 = *piVar5;
  index = index_00 + iVar7;
  for (; index = index + -1, index_00 < index; index_00 = index_00 + 1) {
    pcVar4 = Vector<char>::operator[](&buffer_local,index_00);
    cVar1 = *pcVar4;
    pcVar4 = Vector<char>::operator[](&buffer_local,index);
    cVar2 = *pcVar4;
    pcVar4 = Vector<char>::operator[](&buffer_local,index_00);
    *pcVar4 = cVar2;
    pcVar4 = Vector<char>::operator[](&buffer_local,index);
    *pcVar4 = cVar1;
  }
  *piVar5 = *piVar5 + iVar7;
  return;
}

Assistant:

static void FillDigits32(uint32_t number, Vector<char> buffer, int* length) {
  int number_length = 0;
  // We fill the digits in reverse order and exchange them afterwards.
  while (number != 0) {
    int digit = number % 10;
    number /= 10;
    buffer[(*length) + number_length] = static_cast<char>('0' + digit);
    number_length++;
  }
  // Exchange the digits.
  int i = *length;
  int j = *length + number_length - 1;
  while (i < j) {
    char tmp = buffer[i];
    buffer[i] = buffer[j];
    buffer[j] = tmp;
    i++;
    j--;
  }
  *length += number_length;
}